

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

void __thiscall llvm::DWARFDebugNames::Abbrev::dump(Abbrev *this,ScopedPrinter *W)

{
  raw_ostream *prVar1;
  AttributeEncoding *Attr;
  pointer Vals;
  Twine local_f0;
  Twine local_d8;
  Twine local_c0;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Form_&>_>_>
  local_a8;
  ulong local_48;
  pointer local_40;
  DelimitedScope<___,____> local_38;
  DictScope AbbrevScope;
  
  Twine::Twine(&local_d8,"Abbreviation 0x");
  local_48 = (ulong)this->Code;
  Twine::utohexstr(&local_c0,&local_48);
  Twine::concat(&local_f0,&local_d8,&local_c0);
  Twine::str_abi_cxx11_((string *)&local_a8,&local_f0);
  DelimitedScope<'{',_'}'>::DelimitedScope(&local_38,W,local_a8.super_formatv_object_base.Fmt);
  std::__cxx11::string::~string((string *)&local_a8);
  prVar1 = ScopedPrinter::startLine(W);
  formatv<const_llvm::dwarf::Tag_&>
            ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
              *)&local_a8,"Tag: {0}\n",&this->Tag);
  raw_ostream::operator<<(prVar1,&local_a8.super_formatv_object_base);
  formatv_object_base::~formatv_object_base(&local_a8.super_formatv_object_base);
  local_40 = (this->Attributes).
             super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (Vals = (this->Attributes).
              super__Vector_base<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
              ._M_impl.super__Vector_impl_data._M_start; Vals != local_40; Vals = Vals + 1) {
    prVar1 = ScopedPrinter::startLine(W);
    formatv<const_llvm::dwarf::Index_&,_const_llvm::dwarf::Form_&>
              (&local_a8,"{0}: {1}\n",&Vals->Index,&Vals->Form);
    raw_ostream::operator<<(prVar1,&local_a8.super_formatv_object_base);
    formatv_object_base::~formatv_object_base(&local_a8.super_formatv_object_base);
  }
  DelimitedScope<'{',_'}'>::~DelimitedScope(&local_38);
  return;
}

Assistant:

void DWARFDebugNames::Abbrev::dump(ScopedPrinter &W) const {
  DictScope AbbrevScope(W, ("Abbreviation 0x" + Twine::utohexstr(Code)).str());
  W.startLine() << formatv("Tag: {0}\n", Tag);

  for (const auto &Attr : Attributes)
    W.startLine() << formatv("{0}: {1}\n", Attr.Index, Attr.Form);
}